

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaNormalTargetGenerator::LanguageLinkerRule
          (string *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  TargetType targetType;
  cmGeneratorTarget *pcVar1;
  string *args;
  string *name;
  string local_d0;
  cmAlphaNum local_b0;
  string local_70;
  cmAlphaNum local_50;
  string *local_20;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmNinjaNormalTargetGenerator *)__return_storage_ptr__;
  TargetLinkLanguage(&local_70,this,config);
  cmAlphaNum::cmAlphaNum(&local_50,&local_70);
  cmAlphaNum::cmAlphaNum(&local_b0,"_");
  pcVar1 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  targetType = cmGeneratorTarget::GetType(pcVar1);
  args = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  pcVar1 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  name = cmGeneratorTarget::GetName_abi_cxx11_(pcVar1);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_d0,name);
  cmStrCat<std::__cxx11::string,char[10],std::__cxx11::string,char[2],std::__cxx11::string>
            (__return_storage_ptr__,&local_50,&local_b0,args,(char (*) [10])0xc36e72,&local_d0,
             (char (*) [2])0xc7f155,local_20);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaNormalTargetGenerator::LanguageLinkerRule(
  const std::string& config) const
{
  return cmStrCat(
    this->TargetLinkLanguage(config), "_",
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()),
    "_LINKER__",
    cmGlobalNinjaGenerator::EncodeRuleName(
      this->GetGeneratorTarget()->GetName()),
    "_", config);
}